

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O2

SmallBuffer *
helics::typeConvertComplex
          (SmallBuffer *__return_storage_ptr__,DataType type,double *vals,size_t size)

{
  value_t vVar1;
  json_value jVar2;
  char *pcVar3;
  string *val;
  reference pvVar4;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *extraout_RDX;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val_00;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *extraout_RDX_00;
  _Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *this;
  bool bVar5;
  double dVar6;
  string_view valname;
  initializer_list_t init;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> cvec_1;
  json jsonArray;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> cvec;
  data local_48;
  data local_38;
  
  this = (_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&cvec_1;
  if (vals == (double *)0x0 || size == 0) {
    emptyBlock(__return_storage_ptr__,type,HELICS_COMPLEX_VECTOR);
    return __return_storage_ptr__;
  }
  if (size == 1) {
    cvec_1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*vals;
    cvec_1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)vals[1];
    typeConvert(__return_storage_ptr__,type,(complex<double> *)&cvec_1);
    return __return_storage_ptr__;
  }
  switch(type) {
  case HELICS_STRING:
  case HELICS_CHAR:
    cvec.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    cvec.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    cvec.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve(&cvec,size);
    val_00 = extraout_RDX;
    while (bVar5 = size != 0, size = size - 1, bVar5) {
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      emplace_back<double_const&,double_const&>
                ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&cvec,vals,
                 vals + 1);
      vals = vals + 2;
      val_00 = extraout_RDX_00;
    }
    helicsComplexVectorString_abi_cxx11_((string *)&cvec_1,(helics *)&cvec,val_00);
    jsonArray.m_data._0_8_ =
         cvec_1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    jsonArray.m_data.m_value.object =
         (object_t *)
         cvec_1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&jsonArray
              );
    std::__cxx11::string::~string((string *)&cvec_1);
    this = (_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&cvec;
    goto LAB_001e7965;
  case HELICS_DOUBLE:
    cvec_1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)vectorNorm(vals,size);
    ValueConverter<double>::convert(__return_storage_ptr__,(double *)&cvec_1);
    break;
  case HELICS_INT:
    dVar6 = vectorNorm(vals,size);
    cvec_1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(long)dVar6;
    goto LAB_001e7879;
  case HELICS_COMPLEX:
    cvec_1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*vals;
    cvec_1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)vals[1];
    ValueConverter<std::complex<double>_>::convert
              (__return_storage_ptr__,(complex<double> *)&cvec_1);
    break;
  case HELICS_COMPLEX_VECTOR:
    cvec_1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    cvec_1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    cvec_1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve(&cvec_1,size)
    ;
    while (bVar5 = size != 0, size = size - 1, bVar5) {
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      emplace_back<double_const&,double_const&>
                ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&cvec_1,vals,
                 vals + 1);
      vals = vals + 2;
    }
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    convert(__return_storage_ptr__,&cvec_1);
LAB_001e7965:
    CLI::std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::
    ~_Vector_base(this);
    break;
  case HELICS_NAMED_POINT:
    helicsVectorString_abi_cxx11_((string *)&cvec,(helics *)vals,(double *)size,0x33bf28);
    dVar6 = nan("0");
    valname._M_str =
         (char *)cvec.
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    valname._M_len =
         (size_t)cvec.
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    NamedPoint::NamedPoint((NamedPoint *)&cvec_1,valname,dVar6);
    ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,(NamedPoint *)&cvec_1);
    std::__cxx11::string::~string((string *)&cvec_1);
    std::__cxx11::string::~string((string *)&cvec);
    break;
  case HELICS_BOOL:
    dVar6 = vectorNorm(vals,size);
    pcVar3 = "+0";
    if (dVar6 != 0.0) {
      pcVar3 = "*1";
    }
    if (NAN(dVar6)) {
      pcVar3 = "*1";
    }
    cvec_1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(pcVar3 + 1);
    cvec_1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x1;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&cvec_1);
    break;
  case HELICS_TIME:
    dVar6 = vectorNorm(vals,size);
    cvec_1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)count_time<9,_long>::convert(dVar6);
LAB_001e7879:
    ValueConverter<long>::convert(__return_storage_ptr__,(long *)&cvec_1);
    break;
  default:
    if (type == HELICS_JSON) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&cvec,(nullptr_t)0x0);
      val = typeNameStringRef_abi_cxx11_(HELICS_VECTOR);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_38,val);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&cvec,"type");
      vVar1 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_38.m_type;
      jVar2 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_38.m_value;
      local_38.m_type = vVar1;
      local_38.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_38);
      init._M_len = 0;
      init._M_array = (iterator)&jsonArray;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::array(init);
      while (bVar5 = size != 0, size = size - 1, bVar5) {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json<const_double_&,_double,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&cvec_1,vals);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back(&jsonArray,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)&cvec_1);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)&cvec_1);
        vals = vals + 1;
      }
      local_48.m_type = jsonArray.m_data.m_type;
      local_48._1_7_ = jsonArray.m_data._1_7_;
      local_48.m_value = jsonArray.m_data.m_value;
      jsonArray.m_data._0_8_ = jsonArray.m_data._0_8_ & 0xffffffffffffff00;
      jsonArray.m_data.m_value.object = (object_t *)0x0;
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&cvec,"value");
      vVar1 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_48.m_type;
      local_48.m_type = vVar1;
      jVar2 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_48.m_value;
      local_48.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_48);
      fileops::generateJsonString((string *)&cvec_1,(json *)&cvec,true);
      SmallBuffer::SmallBuffer<std::__cxx11::string,void>
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cvec_1);
      std::__cxx11::string::~string((string *)&cvec_1);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&jsonArray.m_data);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&cvec);
      return __return_storage_ptr__;
    }
  case HELICS_VECTOR:
    ValueConverter<double>::convert(__return_storage_ptr__,vals,size);
    return __return_storage_ptr__;
  }
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvertComplex(DataType type, const double* vals, size_t size)
{
    if ((vals == nullptr) || (size == 0)) {
        return emptyBlock(type, DataType::HELICS_COMPLEX_VECTOR);
    }
    if (size == 1) {
        // treat like a single complex
        return typeConvert(type, std::complex<double>{vals[0], vals[1]});
    }
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(vectorNorm(vals, size));
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(Time(vectorNorm(vals, size)).getBaseTimeCode());
        case DataType::HELICS_INT:
            return ValueConverter<int64_t>::convert(static_cast<int64_t>(vectorNorm(vals, size)));
        case DataType::HELICS_COMPLEX: {
            const std::complex<double> cval(vals[0], vals[1]);
            return ValueConverter<std::complex<double>>::convert(cval);
        }
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((vectorNorm(vals, size) != 0.0) ? "1" :
                                                                                               "0");
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR: {
            std::vector<std::complex<double>> cvec;
            cvec.reserve(size);
            for (size_t ii = 0; ii < size; ++ii) {
                cvec.emplace_back(vals[2 * ii], vals[2 * ii + 1]);
            }
            return ValueConverter<std::string_view>::convert(helicsComplexVectorString(cvec));
        }
        case DataType::HELICS_NAMED_POINT:
            return ValueConverter<NamedPoint>::convert(
                NamedPoint{helicsVectorString(vals, size), std::nan("0")});
        case DataType::HELICS_COMPLEX_VECTOR: {
            std::vector<std::complex<double>> cvec;
            cvec.reserve(size);
            for (size_t ii = 0; ii < size; ++ii) {
                cvec.emplace_back(vals[2 * ii], vals[2 * ii + 1]);
            }
            return ValueConverter<std::vector<std::complex<double>>>::convert(cvec);
        } break;
        case DataType::HELICS_VECTOR:
        default:
            return ValueConverter<double>::convert(vals, size);
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_VECTOR);
            nlohmann::json jsonArray = nlohmann::json::array();
            for (size_t ii = 0; ii < size; ++ii) {
                jsonArray.push_back(vals[ii]);
            }
            json["value"] = std::move(jsonArray);
            return fileops::generateJsonString(json);
        }
    }
}